

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cmdline.c
# Opt level: O0

int cmdline_set_path(archive_cmdline *data,char *path)

{
  size_t sVar1;
  char *pcVar2;
  char *newptr;
  char *path_local;
  archive_cmdline *data_local;
  
  pcVar2 = data->path;
  sVar1 = strlen(path);
  pcVar2 = (char *)realloc(pcVar2,sVar1 + 1);
  if (pcVar2 == (char *)0x0) {
    data_local._4_4_ = -0x1e;
  }
  else {
    data->path = pcVar2;
    strcpy(data->path,path);
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int
cmdline_set_path(struct archive_cmdline *data, const char *path)
{
	char *newptr;

	newptr = realloc(data->path, strlen(path) + 1);
	if (newptr == NULL)
		return (ARCHIVE_FATAL);
	data->path = newptr;
	strcpy(data->path, path);
	return (ARCHIVE_OK);
}